

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorWell::mousePressEvent(QColorWell *this,QMouseEvent *e)

{
  long lVar1;
  int xpos;
  QPoint QVar2;
  QMouseEvent *in_RSI;
  QWellArray *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffb8;
  QWellArray *this_00;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  xpos = QWellArray::selectedRow(in_RDI);
  QWellArray::selectedColumn(in_RDI);
  QPoint::QPoint((QPoint *)in_RDI,xpos,in_stack_ffffffffffffffb8);
  *(undefined8 *)&in_RDI[1].super_QWidget.field_0x14 = local_10;
  QWellArray::mousePressEvent(this_00,in_RSI);
  in_RDI[1].super_QWidget.field_0x8 = 1;
  QSinglePointEvent::position((QSinglePointEvent *)0x731bf8);
  QVar2 = QPointF::toPoint((QPointF *)this_00);
  *(QPoint *)&in_RDI[1].super_QWidget.field_0xc = QVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorWell::mousePressEvent(QMouseEvent *e)
{
    oldCurrent = QPoint(selectedRow(), selectedColumn());
    QWellArray::mousePressEvent(e);
    mousePressed = true;
    pressPos = e->position().toPoint();
}